

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O2

void nivalis::anon_unknown_1::buf_add_polyline
               (vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
                *draw_buf,View *render_view,
               vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *points,
               color *c,size_t rel_func,float thickness,bool closed,bool line,bool filled)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  size_t i;
  ulong uVar8;
  double dVar9;
  DrawBufferObject obj;
  undefined1 local_e0 [48];
  DrawBufferObject obj_fill;
  
  DrawBufferObject::DrawBufferObject(&obj_fill);
  obj_fill.thickness = 2.0;
  obj_fill.rel_func = (size_t)c;
  if (line) {
    std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator=
              (&obj_fill.points,
               (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
               render_view);
    obj_fill.type = FILLED_POLYGON;
    get_ineq_color((color *)&obj,(color *)points);
    color::color::operator=((color *)local_e0,&obj_fill.c,(color *)&obj);
    std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::
    emplace_back<nivalis::DrawBufferObject>(draw_buf,&obj_fill);
  }
  if (closed) {
    DrawBufferObject::DrawBufferObject(&obj);
    DrawBufferObject::operator=(&obj,&obj_fill);
    color::color::operator=((color *)local_e0,&obj.c,(color *)points);
    obj.type = (anon_enum_32)rel_func & 0xff;
    std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::reserve
              (&obj.points,(long)render_view->xmax - *(long *)render_view >> 4);
    lVar6 = 8;
    for (uVar8 = 0; lVar7 = *(long *)render_view,
        uVar8 < (ulong)((long)render_view->xmax - lVar7 >> 4); uVar8 = uVar8 + 1) {
      lVar5 = (long)obj.points.
                    super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)obj.points.
                    super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_e0._0_8_ = *(double *)(lVar7 + -8 + lVar6);
      local_e0._8_8_ = *(double *)(lVar7 + lVar6);
      std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>::
      emplace_back<std::array<double,2ul>>
                ((vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>> *)&obj,
                 (array<double,_2UL> *)local_e0);
      if (1 < (ulong)(lVar5 >> 4)) {
        lVar7 = (lVar5 >> 4) - 1;
        dVar1 = obj.points.
                super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar7]._M_elems[0];
        dVar9 = obj.points.
                super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar7]._M_elems[1];
        dVar2 = *(double *)
                 ((long)obj.points.
                        super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar5 + -0x20);
        dVar3 = *(double *)
                 ((long)obj.points.
                        super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar5 + -0x18);
        dVar4 = atan2(*(double *)
                       ((long)obj.points.
                              super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar5 + 8) - dVar9,
                      *(double *)
                       ((long)obj.points.
                              super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar5) - dVar1);
        dVar4 = fmod(dVar4 + 6.283185307179586,6.283185307179586);
        dVar1 = atan2(dVar9 - dVar3,dVar1 - dVar2);
        dVar1 = fmod(dVar1 + 6.283185307179586,6.283185307179586);
        dVar9 = ABS((dVar4 + 6.283185307179586) - dVar1);
        if (ABS(dVar4 - dVar1) <= dVar9) {
          dVar9 = ABS(dVar4 - dVar1);
        }
        if (ABS(dVar9 + -3.141592653589793) < 0.1) {
          std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::
          push_back(draw_buf,&obj);
          dVar1 = obj.points.
                  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar7]._M_elems[1];
          (obj.points.
           super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
           _M_impl.super__Vector_impl_data._M_start)->_M_elems[0] =
               obj.points.
               super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar7]._M_elems[0];
          (obj.points.
           super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
           _M_impl.super__Vector_impl_data._M_start)->_M_elems[1] = dVar1;
          dVar1 = ((double *)
                  ((long)obj.points.
                         super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar5))[1];
          obj.points.
          super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
          _M_impl.super__Vector_impl_data._M_start[1]._M_elems[0] =
               *(double *)
                ((long)obj.points.
                       super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar5);
          obj.points.
          super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
          _M_impl.super__Vector_impl_data._M_start[1]._M_elems[1] = dVar1;
          std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::resize
                    (&obj.points,2);
        }
      }
      lVar6 = lVar6 + 0x10;
    }
    std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::push_back
              (draw_buf,&obj);
    DrawBufferObject::~DrawBufferObject(&obj);
  }
  DrawBufferObject::~DrawBufferObject(&obj_fill);
  return;
}

Assistant:

void buf_add_polyline(
        std::vector<DrawBufferObject>& draw_buf,
        const Plotter::View& render_view,
        const std::vector<std::array<double, 2> >& points,
        const color::color& c, size_t rel_func, float thickness = 1.,
        bool closed = false, bool line = true, bool filled = false) {
    DrawBufferObject obj_fill;
    obj_fill.rel_func = rel_func;
    obj_fill.thickness = thickness;
    if (filled) {
        obj_fill.points = points;
        obj_fill.type = DrawBufferObject::FILLED_POLYGON;
        obj_fill.c = get_ineq_color(c);
        draw_buf.push_back(std::move(obj_fill));
    }
    if (line) {
        // Detect colinearities
        DrawBufferObject obj;
        obj = obj_fill;
        obj.c = c;
        obj.type = closed ? DrawBufferObject::POLYGON :
            DrawBufferObject::POLYLINE;
        obj.points.reserve(points.size());
        // draw_buf.push_back(std::move(obj_tmp));
        for (size_t i = 0; i < points.size(); ++i) {
            // if (std::isnan(points[i][0])) break;
            size_t j = obj.points.size();
            obj.points.push_back({points[i][0], points[i][1]});
            if (j >= 2) {
                double ax = (obj.points[j][0] - obj.points[j-1][0]);
                double ay = (obj.points[j][1] - obj.points[j-1][1]);
                double bx = (obj.points[j-1][0] - obj.points[j-2][0]);
                double by = (obj.points[j-1][1] - obj.points[j-2][1]);
                double theta_a = std::fmod(std::atan2(ay, ax) + 2*M_PI, 2*M_PI);
                double theta_b = std::fmod(std::atan2(by, bx) + 2*M_PI, 2*M_PI);
                double angle_between = std::min(std::fabs(theta_a - theta_b),
                        std::fabs(theta_a + 2*M_PI - theta_b));
                if (std::fabs(angle_between - M_PI) < 1e-1) {
                    // Near-colinear, currently ImGui's polyline drawing may will break
                    // in this case. We split the obj.points here.
                    draw_buf.push_back(obj);
                    obj.points[0] = obj.points[j-1]; obj.points[1] = obj.points[j];
                    obj.points.resize(2);
                }
            }
        }
        draw_buf.push_back(obj);
    }
}